

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicNotify
          (BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef notifyCount,
          char *memoryName)

{
  char *notifyCount_00;
  BinaryenExpressionRef ptr_00;
  AtomicNotify *pAVar1;
  Name memory;
  Address local_38;
  Builder local_30;
  char *local_28;
  char *memoryName_local;
  BinaryenExpressionRef notifyCount_local;
  BinaryenExpressionRef ptr_local;
  BinaryenModuleRef module_local;
  
  local_28 = memoryName;
  memoryName_local = (char *)notifyCount;
  notifyCount_local = ptr;
  ptr_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_30,module);
  ptr_00 = notifyCount_local;
  notifyCount_00 = memoryName_local;
  wasm::Address::Address(&local_38,0);
  memory = getMemoryName((BinaryenModuleRef)ptr_local,local_28);
  pAVar1 = wasm::Builder::makeAtomicNotify
                     (&local_30,ptr_00,(Expression *)notifyCount_00,local_38,memory);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicNotify(BinaryenModuleRef module,
                                           BinaryenExpressionRef ptr,
                                           BinaryenExpressionRef notifyCount,
                                           const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicNotify((Expression*)ptr,
                        (Expression*)notifyCount,
                        0,
                        getMemoryName(module, memoryName)));
}